

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxAbs::Resolve(FxAbs *this,FCompileContext *ctx)

{
  PType *pPVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  FxConstant *this_00;
  undefined4 uVar4;
  FScriptPosition *other;
  FxExpression *v;
  FxExpression *pFVar5;
  ExpVal value;
  anon_union_8_3_addc324a_for_ExpVal_1 local_30;
  ExpVal local_28;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->val != (FxExpression *)0x0) {
    iVar3 = (*this->val->_vptr_FxExpression[2])();
    this->val = (FxExpression *)CONCAT44(extraout_var,iVar3);
  }
  pFVar5 = this->val;
  if (pFVar5 == (FxExpression *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  if (pFVar5->ValueType == (PType *)TypeBool) {
    this->val = (FxExpression *)0x0;
LAB_0052eb0c:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return pFVar5;
  }
  cVar2 = (**(code **)(*(long *)&pFVar5->ValueType->super_PTypeBase + 0x40))();
  if (cVar2 == '\0') {
    pFVar5 = (FxExpression *)0x0;
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
    goto LAB_0052eb0c;
  }
  iVar3 = (*this->val->_vptr_FxExpression[3])();
  if ((char)iVar3 == '\0') {
    (this->super_FxExpression).ValueType = this->val->ValueType;
    return &this->super_FxExpression;
  }
  pPVar1 = (PType *)this->val[1]._vptr_FxExpression;
  other = &this->val[1].ScriptPosition;
  if (pPVar1 == (PType *)TypeString) {
    FString::AttachToOther((FString *)&local_30,&other->FileName);
  }
  else {
    local_30 = (anon_union_8_3_addc324a_for_ExpVal_1)(other->FileName).Chars;
  }
  if (pPVar1->RegType == '\x01') {
    local_30.Float = local_30.Float & 0x7fffffffffffffff;
  }
  else {
    if (pPVar1->RegType != '\0') {
      this_00 = (FxConstant *)0x0;
      goto LAB_0052ebd8;
    }
    uVar4 = -local_30.Int;
    if (0 < local_30.Int) {
      uVar4 = local_30.Int;
    }
    local_30.Int = uVar4;
  }
  this_00 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
  local_28.Type = pPVar1;
  if (pPVar1 == (PType *)TypeString) {
    FString::AttachToOther((FString *)&local_28.field_1,(FString *)&local_30);
  }
  else {
    local_28.field_1 = local_30;
  }
  FxConstant::FxConstant(this_00,&local_28,&(this->super_FxExpression).ScriptPosition);
  if (local_28.Type == (PType *)TypeString) {
    FString::~FString((FString *)&local_28.field_1);
  }
LAB_0052ebd8:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  if (pPVar1 != (PType *)TypeString) {
    return &this_00->super_FxExpression;
  }
  FString::~FString((FString *)&local_30);
  return &this_00->super_FxExpression;
}

Assistant:

FxExpression *FxAbs::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(val, ctx);

	if (val->ValueType == TypeBool)	// abs of a boolean is always the same as the operand
	{
		auto v = val;
		val = nullptr;
		delete this;
		return v;
	}
	if (!val->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return nullptr;
	}
	else if (val->isConstant())
	{
		ExpVal value = static_cast<FxConstant *>(val)->GetValue();
		switch (value.Type->GetRegType())
		{
		case REGT_INT:
			value.Int = abs(value.Int);
			break;

		case REGT_FLOAT:
			value.Float = fabs(value.Float);
			break;

		default:
			// shouldn't happen
			delete this;
			return nullptr;
		}
		FxExpression *x = new FxConstant(value, ScriptPosition);
		delete this;
		return x;
	}
	ValueType = val->ValueType;
	return this;
}